

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS ref_cavity_form_ball(REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node)

{
  int iVar1;
  REF_ADJ pRVar2;
  REF_INT *pRVar3;
  REF_ADJ_ITEM pRVar4;
  uint uVar5;
  int iVar6;
  REF_STATUS RVar7;
  REF_INT *pRVar8;
  long lVar9;
  REF_CELL pRVar10;
  undefined8 uVar11;
  long lVar12;
  long lVar13;
  REF_LIST ref_list;
  ulong uVar14;
  char *pcVar15;
  REF_CELL pRVar16;
  REF_INT RVar17;
  REF_NODE ref_node;
  REF_BOOL already_have_it;
  REF_BOOL all_local;
  REF_INT seg_nodes [3];
  REF_INT face_nodes [3];
  int local_70;
  int local_6c;
  REF_CELL local_68;
  int local_60;
  int local_5c;
  REF_INT local_58;
  int local_54 [3];
  REF_NODE local_48;
  long local_40;
  long local_38;
  
  ref_node = ref_grid->node;
  ref_cavity->ref_grid = ref_grid;
  ref_cavity->node = node;
  lVar12 = (long)node;
  if (ref_node->ref_mpi->id != ref_node->part[lVar12]) {
LAB_001a200a:
    ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
    return 0;
  }
  if ((0 < ref_grid->cell[9]->n) || (0 < ref_grid->cell[10]->n)) {
    ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return 0;
  }
  if (node < 0) {
LAB_001a2025:
    RVar7 = ref_cavity_verify_face_manifold(ref_cavity);
    if (RVar7 == 0) {
      RVar7 = ref_cavity_verify_seg_manifold(ref_cavity);
      if (RVar7 == 0) {
        return 0;
      }
      pcVar15 = "ball seg manifold";
      uVar11 = 0x371;
    }
    else {
      pcVar15 = "ball face manifold";
      uVar11 = 0x370;
    }
    uVar5 = 1;
    uVar14 = 1;
  }
  else {
    pRVar2 = ref_grid->cell[8]->ref_adj;
    if ((node < pRVar2->nnode) && (lVar9 = (long)pRVar2->first[lVar12], lVar9 != -1)) {
      RVar17 = pRVar2->item[lVar9].ref;
      local_68 = ref_grid->cell[8];
      local_40 = lVar9;
      local_38 = lVar12;
      uVar5 = ref_list_contains(ref_cavity->tet_list,RVar17,&local_70);
      while (uVar5 == 0) {
        local_48 = ref_node;
        if (local_70 != 0) {
          pcVar15 = "added tet twice?";
          uVar11 = 0x33a;
          goto LAB_001a20e9;
        }
        uVar5 = ref_list_push(ref_cavity->tet_list,RVar17);
        if (uVar5 != 0) {
          uVar14 = (ulong)uVar5;
          pcVar15 = "save tet";
          uVar11 = 0x33b;
          goto LAB_001a20b9;
        }
        uVar5 = ref_cell_all_local(local_68,ref_node,RVar17,&local_6c);
        if (uVar5 != 0) {
          uVar14 = (ulong)uVar5;
          pcVar15 = "local cell";
          uVar11 = 0x33c;
          goto LAB_001a20b9;
        }
        if (local_6c == 0) goto LAB_001a200a;
        iVar6 = local_68->face_per;
        pRVar16 = local_68;
        if (0 < iVar6) {
          lVar12 = 0;
          lVar9 = 0;
          do {
            pRVar8 = pRVar16->c2n;
            iVar1 = pRVar16->size_per;
            pRVar3 = pRVar16->f2n;
            lVar13 = 0;
            do {
              local_54[lVar13] =
                   pRVar8[(long)*(int *)((long)pRVar3 + lVar13 * 4 + lVar12) +
                          (long)iVar1 * (long)RVar17];
              lVar13 = lVar13 + 1;
            } while (lVar13 != 3);
            if (((local_54[0] != node) && (local_54[1] != node)) && (local_54[2] != node)) {
              uVar5 = ref_cavity_insert_face(ref_cavity,local_54);
              if (uVar5 != 0) {
                pcVar15 = "tet side";
                uVar11 = 0x349;
                uVar14 = (ulong)uVar5;
                goto LAB_001a20bc;
              }
              iVar6 = local_68->face_per;
              pRVar16 = local_68;
            }
            lVar9 = lVar9 + 1;
            lVar12 = lVar12 + 0x10;
          } while (lVar9 < iVar6);
        }
        pRVar4 = pRVar16->ref_adj->item;
        lVar12 = (long)pRVar4[(int)local_40].next;
        if (lVar12 == -1) {
          lVar12 = local_38;
          ref_node = local_48;
          if (-1 < node) goto LAB_001a1e6d;
          goto LAB_001a2025;
        }
        RVar17 = pRVar4[lVar12].ref;
        local_40 = lVar12;
        uVar5 = ref_list_contains(ref_cavity->tet_list,RVar17,&local_70);
        ref_node = local_48;
      }
      uVar14 = (ulong)uVar5;
      pcVar15 = "have tet?";
      uVar11 = 0x339;
    }
    else {
LAB_001a1e6d:
      pRVar16 = ref_grid->cell[3];
      pRVar2 = pRVar16->ref_adj;
      if ((pRVar2->nnode <= node) ||
         (pRVar10 = (REF_CELL)(long)pRVar2->first[lVar12], pRVar10 == (REF_CELL)0xffffffffffffffff))
      goto LAB_001a2025;
      RVar17 = pRVar2->item[(long)pRVar10].ref;
      ref_list = ref_cavity->tri_list;
      local_68 = pRVar10;
      while (uVar5 = ref_list_contains(ref_list,RVar17,&local_70), uVar5 == 0) {
        if (local_70 != 0) {
          pcVar15 = "added tri twice?";
          uVar11 = 0x353;
LAB_001a20e9:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 uVar11,"ref_cavity_form_ball",pcVar15);
          return 1;
        }
        uVar5 = ref_list_push(ref_cavity->tri_list,RVar17);
        if (uVar5 != 0) {
          uVar14 = (ulong)uVar5;
          pcVar15 = "save tri";
          uVar11 = 0x354;
          goto LAB_001a20b9;
        }
        uVar5 = ref_cell_all_local(pRVar16,ref_node,RVar17,&local_6c);
        if (uVar5 != 0) {
          uVar14 = (ulong)uVar5;
          pcVar15 = "local cell";
          uVar11 = 0x355;
          goto LAB_001a20b9;
        }
        if (local_6c == 0) goto LAB_001a200a;
        pRVar8 = pRVar16->c2n;
        lVar9 = (long)RVar17;
        lVar12 = pRVar16->size_per * lVar9;
        local_58 = pRVar8[(long)(int)lVar12 + (long)pRVar16->node_per];
        local_60 = pRVar8[lVar12 + 1];
        local_5c = pRVar8[lVar12 + 2];
        if (local_5c != node && local_60 != node) {
          uVar5 = ref_cavity_insert_seg(ref_cavity,&local_60);
          if (uVar5 != 0) {
            uVar14 = (ulong)uVar5;
            pcVar15 = "tri side";
            uVar11 = 0x360;
            goto LAB_001a20b9;
          }
          pRVar8 = pRVar16->c2n;
          lVar12 = pRVar16->size_per * lVar9;
        }
        local_60 = pRVar8[lVar12 + 2];
        local_5c = pRVar8[lVar12];
        if (local_5c != node && local_60 != node) {
          uVar5 = ref_cavity_insert_seg(ref_cavity,&local_60);
          if (uVar5 != 0) {
            uVar14 = (ulong)uVar5;
            pcVar15 = "tri side";
            uVar11 = 0x366;
            goto LAB_001a20b9;
          }
          pRVar8 = pRVar16->c2n;
          lVar12 = pRVar16->size_per * lVar9;
        }
        local_60 = pRVar8[lVar12];
        local_5c = pRVar8[lVar12 + 1];
        if ((local_5c != node && local_60 != node) &&
           (uVar5 = ref_cavity_insert_seg(ref_cavity,&local_60), uVar5 != 0)) {
          uVar14 = (ulong)uVar5;
          pcVar15 = "tri side";
          uVar11 = 0x36c;
          goto LAB_001a20b9;
        }
        pRVar4 = pRVar16->ref_adj->item;
        pRVar10 = (REF_CELL)(long)pRVar4[(int)local_68].next;
        if (pRVar10 == (REF_CELL)0xffffffffffffffff) goto LAB_001a2025;
        RVar17 = pRVar4[(long)pRVar10].ref;
        ref_list = ref_cavity->tri_list;
        local_68 = pRVar10;
      }
      uVar14 = (ulong)uVar5;
      pcVar15 = "have tet?";
      uVar11 = 0x352;
    }
LAB_001a20b9:
    uVar5 = (uint)uVar14;
  }
LAB_001a20bc:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",uVar11,
         "ref_cavity_form_ball",uVar14,pcVar15);
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_ball(REF_CAVITY ref_cavity,
                                        REF_GRID ref_grid, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell_face, face_node, cell;
  REF_BOOL has_node;
  REF_BOOL already_have_it, all_local;
  REF_INT face_nodes[3], seg_nodes[3];

  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node), "init form empty");
  if (!ref_node_owned(ref_node, node)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tet twice?");
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }
    each_ref_cell_cell_face(ref_cell, cell_face) {
      each_ref_cavity_face_node(ref_cavity, face_node) {
        face_nodes[face_node] =
            ref_cell_f2n(ref_cell, face_node, cell_face, cell);
      }
      has_node = (node == face_nodes[0] || node == face_nodes[1] ||
                  node == face_nodes[2]);
      if (!has_node) {
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
      }
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tri twice?");
    RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }

    seg_nodes[2] = ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell);
    seg_nodes[0] = ref_cell_c2n(ref_cell, 1, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 2, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
    seg_nodes[0] = ref_cell_c2n(ref_cell, 2, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 0, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
    seg_nodes[0] = ref_cell_c2n(ref_cell, 0, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 1, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
  }

  RSS(ref_cavity_verify_face_manifold(ref_cavity), "ball face manifold");
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "ball seg manifold");

  return REF_SUCCESS;
}